

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Samba.cpp
# Opt level: O3

ssize_t __thiscall Samba::read(Samba *this,int __fd,void *__buf,size_t __nbytes)

{
  SerialPort *pSVar1;
  uint8_t uVar2;
  int iVar3;
  int iVar4;
  ulong in_RAX;
  undefined4 extraout_var;
  undefined8 *puVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  int size;
  ulong uVar9;
  uint8_t cmd [20];
  char acStack_48 [24];
  
  uVar7 = __nbytes & 0xffffffff;
  uVar8 = (ulong)(uint)__fd;
  uVar6 = (uint)__nbytes;
  if (this->_debug == true) {
    iVar3 = printf("%s(addr=%#x,size=%#x)\n","read",uVar8,uVar7);
    in_RAX = CONCAT44(extraout_var,iVar3);
  }
  if (((this->_isUsb == true) && (0x20 < (int)uVar6)) && (this->_readBufferSize == 0)) {
    if ((uVar6 + 0x7fffffff & uVar6) == 0) {
      uVar2 = readByte(this,__fd);
      *(uint8_t *)__buf = uVar2;
      uVar8 = (ulong)(__fd + 1);
      __buf = (void *)((long)__buf + 1);
      uVar7 = (ulong)(uVar6 - 1);
    }
  }
  else if ((int)uVar6 < 1) {
    return in_RAX;
  }
  while( true ) {
    uVar6 = this->_readBufferSize;
    iVar3 = (int)uVar7;
    uVar9 = (ulong)uVar6;
    if (iVar3 < (int)uVar6) {
      uVar9 = uVar7;
    }
    if ((int)uVar6 < 1) {
      uVar9 = uVar7;
    }
    size = (int)uVar9;
    snprintf(acStack_48,0x14,"R%08X,%08X#",uVar8,uVar9);
    pSVar1 = (this->_port)._M_t.super___uniq_ptr_impl<SerialPort,_std::default_delete<SerialPort>_>.
             _M_t.super__Tuple_impl<0UL,_SerialPort_*,_std::default_delete<SerialPort>_>.
             super__Head_base<0UL,_SerialPort_*,_false>._M_head_impl;
    iVar4 = (*pSVar1->_vptr_SerialPort[6])(pSVar1,acStack_48,0x13);
    if (iVar4 != 0x13) break;
    if (this->_isUsb == true) {
      readBinary(this,(uint8_t *)__buf,size);
    }
    else {
      readXmodem(this,(uint8_t *)__buf,size);
    }
    uVar8 = (ulong)(uint)((int)uVar8 + size);
    __buf = (void *)((long)__buf + uVar9);
    uVar7 = (ulong)(uint)(iVar3 - size);
    if (iVar3 - size == 0 || iVar3 < size) {
      return uVar9;
    }
  }
  puVar5 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar5 = &PTR__exception_001185a0;
  __cxa_throw(puVar5,&SambaError::typeinfo,std::exception::~exception);
}

Assistant:

void
Samba::read(uint32_t addr, uint8_t* buffer, int size)
{
    uint8_t cmd[20];
    int chunk;

    if (_debug)
        printf("%s(addr=%#x,size=%#x)\n", __FUNCTION__, addr, size);

    // The SAM firmware has a bug reading powers of 2 over 32 bytes
    // via USB.  If that is the case here, then read the first byte
    // with a readByte and then read one less than the requested size.
    if (_isUsb && _readBufferSize == 0 && size > 32 && !(size & (size - 1)))
    {
        *buffer = readByte(addr);
        addr++;
        buffer++;
        size--;
    }

    while (size > 0)
    {
        // Handle any limitations on the size of the read
        if (_readBufferSize > 0 && size > _readBufferSize)
            chunk = _readBufferSize;
        else
            chunk = size;

        snprintf((char*) cmd, sizeof(cmd), "R%08X,%08X#", addr, chunk);
        if (_port->write(cmd, sizeof(cmd) - 1) != sizeof(cmd) - 1)
            throw SambaError();

        if (_isUsb)
            readBinary(buffer, chunk);
        else
            readXmodem(buffer, chunk);

        size -= chunk;
        addr += chunk;
        buffer += chunk;
    }
}